

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::write_float<char,fmt::v11::basic_appender<char>,long_double>
          (basic_appender<char> out,longdouble value,format_specs specs,locale_ref loc)

{
  size_t sVar1;
  format_specs specs_00;
  unkbyte10 Var2;
  int iVar3;
  basic_appender<char> bVar4;
  uint uVar5;
  undefined8 uVar6;
  sign s;
  ulong uVar7;
  sign in_R9D;
  int precision;
  format_specs specs_01;
  big_decimal_fp f;
  memory_buffer buffer;
  format_specs local_288;
  undefined1 local_278 [20];
  longdouble local_264;
  big_decimal_fp local_258;
  buffer<char> local_248;
  char local_228 [512];
  
  uVar6 = specs._8_8_;
  local_278._0_10_ = value;
  Var2 = local_278._0_10_;
  local_278._8_2_ = (undefined2)((unkuint10)value >> 0x40);
  local_288.super_basic_specs.data_ = specs.super_basic_specs.data_;
  local_288.super_basic_specs.fill_data_ = specs.super_basic_specs.fill_data_;
  local_288.width = specs.width;
  local_288.precision = specs.precision;
  s = minus;
  if (-1 < (short)local_278._8_2_) {
    s = (sign)((ulong)specs.super_basic_specs >> 10) & space;
  }
  local_278._0_10_ = Var2;
  if (((unkuint10)value & 0x7fff) != 0 &&
      ((ushort)((local_278._8_2_ & 0x7fff) - 1) < 0x7ffe & (byte)((unkuint10)value >> 0x38) >> 7) ==
      0) {
    bVar4.container._1_7_ = 0;
    bVar4.container._0_1_ = NAN(value);
    specs_01.width = s;
    specs_01.super_basic_specs.data_ = (int)uVar6;
    specs_01.super_basic_specs.fill_data_[0] = (char)((ulong)uVar6 >> 0x20);
    specs_01.super_basic_specs.fill_data_[1] = (char)((ulong)uVar6 >> 0x28);
    specs_01.super_basic_specs.fill_data_[2] = (char)((ulong)uVar6 >> 0x30);
    specs_01.super_basic_specs.fill_data_[3] = (char)((ulong)uVar6 >> 0x38);
    specs_01.precision = 0;
    bVar4 = write_nonfinite<char,fmt::v11::basic_appender<char>>
                      (out.container,bVar4,specs.super_basic_specs.data_._0_1_,specs_01,in_R9D);
    return (basic_appender<char>)bVar4.container;
  }
  local_264 = value;
  if ((s != none) && ((local_288.super_basic_specs.data_ & 0x38) == 0x20)) {
    uVar7 = (out.container)->size_ + 1;
    if ((out.container)->capacity_ < uVar7) {
      (*(out.container)->grow_)(out.container,uVar7);
    }
    sVar1 = (out.container)->size_;
    (out.container)->size_ = sVar1 + 1;
    (out.container)->ptr_[sVar1] = (char)(0x202b2d00 >> (sbyte)(s << 3));
    s = none;
    if (local_288.width != 0) {
      local_288.width = local_288.width + -1;
    }
  }
  uVar5 = local_288.super_basic_specs.data_ & 7;
  precision = 6;
  if (uVar5 == 0) {
    precision = local_288.precision;
  }
  if (-1 < local_288.precision) {
    precision = local_288.precision;
  }
  local_248.size_ = 0;
  local_248.grow_ = basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_248.capacity_ = 500;
  local_248.ptr_ = local_228;
  if (((byte)local_288.super_basic_specs.data_ & 7) == 1) {
    if (precision == 0x7fffffff) {
      report_error("number is too big");
    }
    precision = precision + 1;
LAB_00162299:
    if (local_288.precision != 0) {
      local_288.super_basic_specs.data_ = local_288.super_basic_specs.data_ | 0x2000;
    }
  }
  else {
    if (uVar5 == 2) goto LAB_00162299;
    if (uVar5 == 4) {
      if (s != none) {
        local_228[0] = (char)(0x202b2d00 >> (sbyte)(s << 3));
      }
      local_248.size_ = (size_t)(s != none);
      local_248.grow_ = basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
      local_248.capacity_ = 500;
      specs_00.super_basic_specs.fill_data_[0] = local_288.super_basic_specs.fill_data_[0];
      specs_00.super_basic_specs.fill_data_[1] = local_288.super_basic_specs.fill_data_[1];
      specs_00.super_basic_specs.fill_data_[2] = local_288.super_basic_specs.fill_data_[2];
      specs_00.super_basic_specs.fill_data_[3] = local_288.super_basic_specs.fill_data_[3];
      specs_00.super_basic_specs.data_ = local_288.super_basic_specs.data_;
      specs_00.width = local_288.width;
      specs_00.precision = local_288.precision;
      format_hexfloat<long_double,_0>(local_264,specs_00,&local_248);
      local_258.significand = local_248.ptr_;
      local_258.significand_size = (undefined4)local_248.size_;
      local_258.exponent = local_248.size_._4_4_;
      bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_bytes<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,fmt::v11::basic_string_view<char>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                        (out,&local_288,local_248.size_,local_248.size_,
                         (anon_class_16_1_a7b7af8b *)&local_258);
      goto LAB_001622fe;
    }
    precision = precision + (uint)(precision == 0);
  }
  iVar3 = format_float<long_double>(local_264,precision,&local_288,false,&local_248);
  local_258.significand = local_248.ptr_;
  local_258._8_8_ = CONCAT44(iVar3,(int)local_248.size_);
  local_288.precision = precision;
  bVar4 = do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>
                    (out,&local_258,&local_288,s,0x10,loc);
LAB_001622fe:
  if (local_248.ptr_ != local_228) {
    free(local_248.ptr_);
  }
  return (basic_appender<char>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, T value, format_specs specs,
                                 locale_ref loc) -> OutputIt {
  // Use signbit because value < 0 is false for NaN.
  sign s = detail::signbit(value) ? sign::minus : specs.sign();

  if (!detail::isfinite(value))
    return write_nonfinite<Char>(out, detail::isnan(value), specs, s);

  if (specs.align() == align::numeric && s != sign::none) {
    *out++ = detail::getsign<Char>(s);
    s = sign::none;
    if (specs.width != 0) --specs.width;
  }

  constexpr int exp_upper = detail::exp_upper<T>();
  int precision = specs.precision;
  if (precision < 0) {
    if (specs.type() != presentation_type::none) {
      precision = 6;
    } else if (is_fast_float<T>::value && !is_constant_evaluated()) {
      // Use Dragonbox for the shortest format.
      using floaty = conditional_t<sizeof(T) >= sizeof(double), double, float>;
      auto dec = dragonbox::to_decimal(static_cast<floaty>(value));
      return write_float<Char>(out, dec, specs, s, exp_upper, loc);
    }
  }

  memory_buffer buffer;
  if (specs.type() == presentation_type::hexfloat) {
    if (s != sign::none) buffer.push_back(detail::getsign<char>(s));
    format_hexfloat(convert_float(value), specs, buffer);
    return write_bytes<Char, align::right>(out, {buffer.data(), buffer.size()},
                                           specs);
  }

  if (specs.type() == presentation_type::exp) {
    if (precision == max_value<int>())
      report_error("number is too big");
    else
      ++precision;
    if (specs.precision != 0) specs.set_alt();
  } else if (specs.type() == presentation_type::fixed) {
    if (specs.precision != 0) specs.set_alt();
  } else if (precision == 0) {
    precision = 1;
  }
  int exp = format_float(convert_float(value), precision, specs,
                         std::is_same<T, float>(), buffer);

  specs.precision = precision;
  auto f = big_decimal_fp{buffer.data(), static_cast<int>(buffer.size()), exp};
  return write_float<Char>(out, f, specs, s, exp_upper, loc);
}